

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadManager.h
# Opt level: O2

bool SL::Screen_Capture::
     TryCaptureMouse<SL::Screen_Capture::X11MouseProcessor,std::shared_ptr<SL::Screen_Capture::Thread_Data>>
               (shared_ptr<SL::Screen_Capture::Thread_Data> *data)

{
  DUPL_RETURN DVar1;
  DUPL_RETURN DVar2;
  pointer __p_00;
  ostream *poVar3;
  shared_ptr<SL::Screen_Capture::Timer> *__stat_loc;
  char *pcVar4;
  pointer __p;
  shared_ptr<SL::Screen_Capture::Timer> timer;
  X11MouseProcessor frameprocessor;
  __shared_ptr<SL::Screen_Capture::Timer,_(__gnu_cxx::_Lock_policy)2> local_a8;
  duration<long,_std::ratio<1L,_1000L>_> local_90;
  __shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2> local_88;
  X11MouseProcessor local_78;
  
  X11MouseProcessor::X11MouseProcessor(&local_78);
  local_78.super_BaseMouseProcessor.super_BaseFrameProcessor.ImageBufferSize = 0x1000;
  __p_00 = (pointer)operator_new__(0x1000);
  memset(__p_00,0,0x1000);
  local_a8._M_ptr = (Timer *)0x0;
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)
             &local_78.super_BaseMouseProcessor.super_BaseFrameProcessor.ImageBuffer,__p_00);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_a8);
  std::__shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88,
             &data->super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>)
  ;
  DVar1 = X11MouseProcessor::Init
                    (&local_78,(shared_ptr<SL::Screen_Capture::Thread_Data> *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  if (DVar1 == DUPL_RETURN_SUCCESS) {
    do {
      if (((((data->super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>)
            ._M_ptr)->CommonData_).TerminateThreadsEvent._M_base._M_i & 1U) != 0) break;
      local_a8._M_ptr = (Timer *)0x0;
      local_a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __stat_loc = &(((data->
                      super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->ScreenCaptureData).MouseTimer;
      std::__shared_ptr<SL::Screen_Capture::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_a8,
                 &__stat_loc->
                  super___shared_ptr<SL::Screen_Capture::Timer,_(__gnu_cxx::_Lock_policy)2>);
      Timer::start(local_a8._M_ptr);
      DVar2 = X11MouseProcessor::ProcessFrame(&local_78);
      if (DVar2 == DUPL_RETURN_SUCCESS) {
        Timer::wait(local_a8._M_ptr,__stat_loc);
        while (((((data->
                  super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->CommonData_).Paused._M_base._M_i & 1U) != 0) {
          local_90.__r = 0x32;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_90);
        }
      }
      else {
        pcVar4 = "Exiting Thread due to Unexpected error ";
        if (DVar2 == DUPL_RETURN_ERROR_EXPECTED) {
          pcVar4 = "Exiting Thread due to expected error ";
        }
        LOCK();
        (&(((data->super___shared_ptr<SL::Screen_Capture::Thread_Data,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->CommonData_).UnexpectedErrorEvent)[DVar2 == DUPL_RETURN_ERROR_EXPECTED]._M_base.
        _M_i = true;
        UNLOCK();
        poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
    } while (DVar2 == DUPL_RETURN_SUCCESS);
  }
  X11MouseProcessor::~X11MouseProcessor(&local_78);
  return DVar1 == DUPL_RETURN_SUCCESS;
}

Assistant:

bool TryCaptureMouse(const F &data, E... args)
    {
        T frameprocessor;
        frameprocessor.ImageBufferSize = 32 * 32 * sizeof(ImageBGRA);
        frameprocessor.ImageBuffer = std::make_unique<unsigned char[]>(frameprocessor.ImageBufferSize);
        auto ret = frameprocessor.Init(data);
        if (ret != DUPL_RETURN_SUCCESS) {
            return false;
        } 
        while (!data->CommonData_.TerminateThreadsEvent) {
            // get a copy of the shared_ptr in a safe way

            std::shared_ptr<Timer> timer;
            if constexpr(sizeof...(args) == 1) {
                timer = data->WindowCaptureData.MouseTimer;
            }
            else {
                timer = data->ScreenCaptureData.MouseTimer;
            }

            timer->start();
            // Process Frame
            ret = frameprocessor.ProcessFrame();
            if (ret != DUPL_RETURN_SUCCESS) {
                if (ret == DUPL_RETURN_ERROR_EXPECTED) {
                    // The system is in a transition state so request the duplication be restarted
                    data->CommonData_.ExpectedErrorEvent = true;
                    std::cout << "Exiting Thread due to expected error " << std::endl;
                }
                else {
                    // Unexpected error so exit the application
                    data->CommonData_.UnexpectedErrorEvent = true;
                    std::cout << "Exiting Thread due to Unexpected error " << std::endl;
                }
                return true;
            }
            timer->wait();
            while (data->CommonData_.Paused) {
                std::this_thread::sleep_for(50ms);
            }
        }
        return true;
    }